

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O0

int dhm_check_range(mbedtls_mpi *param,mbedtls_mpi *P)

{
  int iVar1;
  int local_4c;
  undefined1 local_48 [4];
  int ret;
  mbedtls_mpi U;
  mbedtls_mpi L;
  mbedtls_mpi *P_local;
  mbedtls_mpi *param_local;
  
  mbedtls_mpi_init((mbedtls_mpi *)&U.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_48);
  local_4c = mbedtls_mpi_lset((mbedtls_mpi *)&U.p,2);
  if ((((local_4c == 0) &&
       (local_4c = mbedtls_mpi_sub_int((mbedtls_mpi *)local_48,P,2), local_4c == 0)) &&
      (iVar1 = mbedtls_mpi_cmp_mpi(param,(mbedtls_mpi *)&U.p), -1 < iVar1)) &&
     (iVar1 = mbedtls_mpi_cmp_mpi(param,(mbedtls_mpi *)local_48), iVar1 < 1)) {
    local_4c = 0;
  }
  mbedtls_mpi_free((mbedtls_mpi *)&U.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_48);
  return local_4c;
}

Assistant:

static int dhm_check_range( const mbedtls_mpi *param, const mbedtls_mpi *P )
{
    mbedtls_mpi L, U;
    int ret = MBEDTLS_ERR_DHM_BAD_INPUT_DATA;

    mbedtls_mpi_init( &L ); mbedtls_mpi_init( &U );

    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &L, 2 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &U, P, 2 ) );

    if( mbedtls_mpi_cmp_mpi( param, &L ) >= 0 &&
        mbedtls_mpi_cmp_mpi( param, &U ) <= 0 )
    {
        ret = 0;
    }

cleanup:
    mbedtls_mpi_free( &L ); mbedtls_mpi_free( &U );
    return( ret );
}